

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Builder.cpp
# Opt level: O0

bool __thiscall arangodb::velocypack::Builder::checkAttributeUniqueness(Builder *this,Slice obj)

{
  Slice obj_00;
  bool bVar1;
  Builder *in_RSI;
  SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *in_RDI;
  Builder *in_stack_00000018;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  bVar1 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::isSorted(in_RDI);
  if (bVar1) {
    bVar1 = checkAttributeUniquenessSorted(in_stack_00000018,(Slice)this);
  }
  else {
    obj_00._start._7_1_ = in_stack_ffffffffffffffff;
    obj_00._start._0_7_ = in_stack_fffffffffffffff8;
    bVar1 = checkAttributeUniquenessUnsorted(in_RSI,obj_00);
  }
  return bVar1;
}

Assistant:

bool Builder::checkAttributeUniqueness(Slice obj) const {
  VELOCYPACK_ASSERT(options->checkAttributeUniqueness == true);
  VELOCYPACK_ASSERT(obj.isObject());
  VELOCYPACK_ASSERT(obj.length() >= 2);

  if (obj.isSorted()) {
    // object attributes are sorted
    return checkAttributeUniquenessSorted(obj);
  }

  return checkAttributeUniquenessUnsorted(obj);
}